

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O2

float sum(string *file_name)

{
  runtime_error *this;
  float fVar1;
  undefined1 auStack_298 [12];
  float local_28c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [2];
  ifstream ifs;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&ifs,(string *)file_name,_S_in);
  if ((abStack_208[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::ios::exceptions((int)auStack_298 + (int)*(long *)(_ifs + -0x18) + 0x70);
    local_28c = 0.0;
    while ((abStack_208[*(long *)(_ifs + -0x18)] & 2) == 0) {
      fVar1 = read_int((istream *)&ifs);
      local_28c = local_28c + fVar1;
    }
    std::ifstream::~ifstream(&ifs);
    return local_28c;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_288,"Could not open \'",file_name);
  std::operator+(local_268,&local_288,"\' for reading.");
  std::runtime_error::runtime_error(this,(string *)local_268);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float sum(const std::string& file_name)
{
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		throw std::runtime_error("Could not open '" +
			file_name + "' for reading.");
	}
	ifs.exceptions(ifs.exceptions()|std::ios_base::badbit);
	float sum{ 0 };
	try
	{
		while (!ifs.eof())
		{
			sum += read_int(ifs);
		}
	}
	catch (const std::exception& e)
	{
		throw std::runtime_error("Found bad symbol in file '" + file_name
			+ "'. " + e.what());
	}
	return sum;
}